

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_common.c
# Opt level: O2

int IoTHubTransport_AMQP_Common_Subscribe(IOTHUB_DEVICE_HANDLE handle)

{
  _Bool _Var1;
  int iVar2;
  LOGGER_LOG p_Var3;
  int iVar4;
  char *pcVar5;
  
  if (handle == (IOTHUB_DEVICE_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    iVar2 = 0x5f2;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x5f2;
    }
    pcVar5 = "Invalid handle to IoTHubClient AMQP transport device handle.";
    iVar4 = 0x5f1;
  }
  else {
    _Var1 = is_device_registered((AMQP_TRANSPORT_DEVICE_INSTANCE *)handle);
    if (_Var1) {
      iVar2 = amqp_device_subscribe_message
                        (*(AMQP_DEVICE_HANDLE *)((long)handle + 8),on_message_received,handle);
      if (iVar2 == 0) {
        return 0;
      }
      STRING_c_str(*handle);
      p_Var3 = xlogging_get_log_function();
      iVar2 = 0x602;
      if (p_Var3 == (LOGGER_LOG)0x0) {
        return 0x602;
      }
      pcVar5 = 
      "Device \'%s\' failed subscribing to cloud-to-device messages (amqp_device_subscribe_message failed)"
      ;
      iVar4 = 0x601;
    }
    else {
      STRING_c_str(*handle);
      p_Var3 = xlogging_get_log_function();
      iVar2 = 0x5fc;
      if (p_Var3 == (LOGGER_LOG)0x0) {
        return 0x5fc;
      }
      pcVar5 = 
      "Device \'%s\' failed subscribing to cloud-to-device messages (device is not registered)";
      iVar4 = 0x5fb;
    }
  }
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
            ,"IoTHubTransport_AMQP_Common_Subscribe",iVar4,1,pcVar5);
  return iVar2;
}

Assistant:

int IoTHubTransport_AMQP_Common_Subscribe(IOTHUB_DEVICE_HANDLE handle)
{
    int result;

    if (handle == NULL)
    {
        LogError("Invalid handle to IoTHubClient AMQP transport device handle.");
        result = MU_FAILURE;
    }
    else
    {
        AMQP_TRANSPORT_DEVICE_INSTANCE* amqp_device_instance = (AMQP_TRANSPORT_DEVICE_INSTANCE*)handle;

        if (!is_device_registered(amqp_device_instance))
        {
            const char* device_id = STRING_c_str(amqp_device_instance->device_id); // advoid MU_P_OR_NULL double call
            LogError("Device '%s' failed subscribing to cloud-to-device messages (device is not registered)", MU_P_OR_NULL(device_id));
            result = MU_FAILURE;
        }
        else if (amqp_device_subscribe_message(amqp_device_instance->device_handle, on_message_received, amqp_device_instance) != RESULT_OK)
        {
            const char* device_id = STRING_c_str(amqp_device_instance->device_id); // advoid MU_P_OR_NULL double call
            LogError("Device '%s' failed subscribing to cloud-to-device messages (amqp_device_subscribe_message failed)", MU_P_OR_NULL(device_id));
            result = MU_FAILURE;
        }
        else
        {
            result = RESULT_OK;
        }
    }

    return result;
}